

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall ON_OBSOLETE_V5_DimAngular::GetArc(ON_OBSOLETE_V5_DimAngular *this,ON_Arc *arc)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ON_2dPoint *pOVar4;
  ON_Interval local_78;
  undefined1 local_68 [8];
  ON_3dVector Y;
  undefined1 local_38 [8];
  ON_3dVector X;
  bool rc;
  ON_Arc *arc_local;
  ON_OBSOLETE_V5_DimAngular *this_local;
  
  X.z._7_1_ = 0;
  bVar2 = ON_IsValid(this->m_radius);
  if (((((((bVar2) && (1.490116119385e-08 < this->m_radius)) &&
         (bVar2 = ON_IsValid(this->m_angle), bVar2)) &&
        ((0.0 < this->m_angle && (this->m_angle <= 6.283185307179586)))) &&
       ((bVar2 = ON_3dPoint::IsValid(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin), bVar2
        && ((bVar2 = ON_3dVector::IsValid(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis),
            bVar2 && (bVar2 = ON_3dVector::IsValid
                                        (&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis),
                     bVar2)))))) &&
      (bVar2 = ON_3dVector::IsValid(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis), bVar2))
     && ((dVar1 = ON_3dVector::Length(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis),
         ABS(dVar1 - 1.0) <= 1.490116119385e-08 &&
         (iVar3 = ON_SimpleArray<ON_2dPoint>::Count
                            (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                              super_ON_SimpleArray<ON_2dPoint>), iVar3 == 4)))) {
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    dVar1 = pOVar4->x;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    ON_Plane::PointAt((ON_3dPoint *)&Y.z,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dVar1,
                      pOVar4->y);
    ON_3dPoint::operator-
              ((ON_3dVector *)local_38,(ON_3dPoint *)&Y.z,
               &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin);
    dVar1 = ON_3dVector::Length((ON_3dVector *)local_38);
    if (((ABS(dVar1 - 1.0) <= 1.490116119385e-08) ||
        (bVar2 = ON_3dVector::Unitize((ON_3dVector *)local_38), bVar2)) &&
       (dVar1 = ON_3dVector::operator*
                          ((ON_3dVector *)local_38,
                           &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis),
       ABS(dVar1) <= 1.490116119385e-08)) {
      ON_CrossProduct((ON_3dVector *)local_68,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis
                      ,(ON_3dVector *)local_38);
      dVar1 = ON_3dVector::Length((ON_3dVector *)local_68);
      if ((ABS(dVar1 - 1.0) <= 1.490116119385e-08) ||
         (bVar2 = ON_3dVector::Unitize((ON_3dVector *)local_68), bVar2)) {
        memcpy(arc,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,0x80);
        (arc->super_ON_Circle).plane.xaxis.x = (double)local_38;
        (arc->super_ON_Circle).plane.xaxis.y = X.x;
        (arc->super_ON_Circle).plane.xaxis.z = X.y;
        (arc->super_ON_Circle).plane.yaxis.x = (double)local_68;
        (arc->super_ON_Circle).plane.yaxis.y = Y.x;
        (arc->super_ON_Circle).plane.yaxis.z = Y.y;
        ON_Plane::UpdateEquation((ON_Plane *)arc);
        ON_Interval::ON_Interval(&local_78,0.0,this->m_angle);
        ON_Arc::SetAngleIntervalRadians(arc,local_78);
        (arc->super_ON_Circle).radius = this->m_radius;
        X.z._7_1_ = 1;
      }
    }
  }
  return (bool)(X.z._7_1_ & 1);
}

Assistant:

bool ON_OBSOLETE_V5_DimAngular::GetArc( ON_Arc& arc ) const
{
  bool rc = false;
  // Jan 25, 2007 - changed min radius from >0 to >ON_SQRT_EPSILON
  // to avoid domain problems trying to use very small arcs later
  if ( ON_IsValid(m_radius) && m_radius > ON_SQRT_EPSILON
      && ON_IsValid(m_angle) && m_angle > 0.0 && m_angle <= 2.0*ON_PI
      && m_plane.origin.IsValid() 
      && m_plane.xaxis.IsValid() 
      && m_plane.yaxis.IsValid() 
      && m_plane.zaxis.IsValid()
      && fabs( m_plane.zaxis.Length() - 1.0 ) <= ON_SQRT_EPSILON
      && 4 == m_points.Count()
      )
  {
    ON_3dVector X = m_plane.PointAt( m_points[start_pt_index].x, m_points[start_pt_index].y ) - m_plane.origin;
    if ( fabs(X.Length()-1.0) <= ON_SQRT_EPSILON || X.Unitize() )
    {
      if ( fabs(X*m_plane.zaxis) <= ON_SQRT_EPSILON )
      {
        ON_3dVector Y = ON_CrossProduct( m_plane.zaxis, X );
        if ( fabs(Y.Length()-1.0) <= ON_SQRT_EPSILON || Y.Unitize() )
        {
          arc.plane = m_plane;
          arc.plane.xaxis = X;
          arc.plane.yaxis = Y;
          arc.plane.UpdateEquation();
          arc.SetAngleIntervalRadians( ON_Interval(0.0,m_angle) );
          arc.radius = m_radius;
          rc = true;
        }
      }
    }
  }

  return rc;
}